

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprint.cpp
# Opt level: O2

InputSlot *
QPrintUtils::paperBinToInputSlot(InputSlot *__return_storage_ptr__,int windowsId,QString *name)

{
  long lVar1;
  long lVar2;
  InputSlotId IVar3;
  char *pcVar4;
  
  __return_storage_ptr__->id = 0xaaaaaaaa;
  __return_storage_ptr__->windowsId = -0x55555556;
  (__return_storage_ptr__->key).d.d = (Data *)0x0;
  (__return_storage_ptr__->key).d.ptr = (char *)0x0;
  (__return_storage_ptr__->key).d.size = 0;
  (__return_storage_ptr__->name).d.d = (Data *)0x0;
  (__return_storage_ptr__->name).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->name).d.size = 0;
  QString::operator=(&__return_storage_ptr__->name,(QString *)name);
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 + 0x10 == 0x100) {
      IVar3 = *(InputSlotId *)((long)&inputSlotMap[0].id + lVar2);
      pcVar4 = "";
      goto LAB_0012d598;
    }
    lVar1 = lVar2 + 0x10;
  } while (*(int *)((long)&inputSlotMap[0].windowsId + lVar2) != windowsId);
  IVar3 = *(InputSlotId *)((long)&inputSlotMap[0].id + lVar2);
  pcVar4 = *(char **)((long)&inputSlotMap[0].key + lVar2);
LAB_0012d598:
  QByteArray::operator=(&__return_storage_ptr__->key,pcVar4);
  __return_storage_ptr__->id = IVar3;
  __return_storage_ptr__->windowsId = windowsId;
  return __return_storage_ptr__;
}

Assistant:

QPrint::InputSlot paperBinToInputSlot(int windowsId, const QString &name)
{
    QPrint::InputSlot slot;
    slot.name = name;
    int i;
    for (i = 0; inputSlotMap[i].id != QPrint::CustomInputSlot; ++i) {
        if (inputSlotMap[i].windowsId == windowsId) {
            slot.key = inputSlotMap[i].key;
            slot.id = inputSlotMap[i].id;
            slot.windowsId = inputSlotMap[i].windowsId;
            return slot;
        }
    }
    slot.key = inputSlotMap[i].key;
    slot.id = inputSlotMap[i].id;
    slot.windowsId = windowsId;
    return slot;
}